

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O1

bool __thiscall
binlog::SessionWriter::addEvent<binlog::ArrayView<int>>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,ArrayView<int> *args)

{
  ulong minQueueCapacity;
  QueueWriter *this_00;
  char **ppcVar1;
  char *pcVar2;
  Queue *pQVar3;
  long lVar4;
  size_t sVar5;
  ArrayView<int> *__range3;
  long lVar6;
  size_t sizes [3];
  long local_48 [3];
  
  local_48[0] = 8;
  local_48[1] = 8;
  local_48[2] = 4;
  if (args->_end != args->_begin) {
    local_48[2] = ((long)args->_end - (long)args->_begin & 0xfffffffffffffffcU) + 4;
  }
  lVar6 = 0;
  lVar4 = 0;
  do {
    lVar6 = lVar6 + *(long *)((long)local_48 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x18);
  minQueueCapacity = lVar6 + 4;
  this_00 = &this->_qw;
  if (((((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity) &&
       (sVar5 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar5 < minQueueCapacity)) &&
      (replaceChannel(this,minQueueCapacity),
      (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity)) &&
     (sVar5 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar5 < minQueueCapacity)) {
    return false;
  }
  *(int *)(this->_qw)._writePos = (int)lVar6;
  pcVar2 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar2 + 4;
  *(uint64_t *)(pcVar2 + 4) = eventSourceId;
  pcVar2 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar2 + 8;
  *(uint64_t *)(pcVar2 + 8) = clock;
  ppcVar1 = &(this->_qw)._writePos;
  *ppcVar1 = *ppcVar1 + 8;
  mserialize::detail::BuiltinSerializer<binlog::ArrayView<int>,_void>::
  serialize<binlog::detail::QueueWriter>(args,this_00);
  pQVar3 = (this->_qw)._queue;
  (pQVar3->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)(this->_qw)._writePos - (long)pQVar3->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}